

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# externals.c
# Opt level: O3

void ucrcourse_results_destroy(course_results *results)

{
  long lVar1;
  ulong uVar2;
  
  if (results != (course_results *)0x0) {
    if (results->length != 0) {
      lVar1 = 0;
      uVar2 = 0;
      do {
        free(*(void **)(results->courses->days + lVar1 + -0x2c));
        free(*(void **)(results->courses->days + lVar1 + -0x1c));
        free(*(void **)(results->courses->days + lVar1 + -0x14));
        free(*(void **)(results->courses->days + lVar1 + -0xc));
        free(*(void **)(results->courses->days + lVar1 + 0x1c));
        free(*(void **)(results->courses->days + lVar1 + 0x24));
        uVar2 = uVar2 + 1;
        lVar1 = lVar1 + 0x68;
      } while (uVar2 < results->length);
    }
    free(results);
    return;
  }
  return;
}

Assistant:

void ucrcourse_results_destroy(struct course_results *results)
{
	size_t i;

	if (!results) {
		return;
	}

	for (i = 0; i < results->length; i++) {
		free((void *)results->courses[i].course_number);
		free((void *)results->courses[i].course_name);
		free((void *)results->courses[i].course_id);
		free((void *)results->courses[i].instructor);
		free((void *)results->courses[i].co_requisites);
		free((void *)results->courses[i].pre_requisites);
	}

	free(results);
}